

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O3

uint32_t spvtools::opt::anon_unknown_0::PerformFloatingPointOperation
                   (ConstantManager *const_mgr,Op opcode,Constant *input1,Constant *input2)

{
  Type *type;
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Constant *c;
  Instruction *this;
  pointer puVar6;
  float fVar7;
  float fVar8;
  FloatProxy<double> val;
  FloatProxy<double> local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  type = input1->type_;
  iVar4 = (*type->_vptr_Type[0xc])(type);
  if (CONCAT44(extraout_var,iVar4) == 0) {
    __assert_fail("type->AsFloat()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x229,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformFloatingPointOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  iVar4 = (*type->_vptr_Type[0xc])(type);
  iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 0x24);
  if ((iVar4 != 0x20) && (iVar4 != 0x40)) {
    __assert_fail("width == 32 || width == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x22b,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformFloatingPointOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(opcode) {
  case OpFAdd:
    if (iVar4 == 0x40) {
      dVar1 = analysis::Constant::GetDouble(input1);
      dVar2 = analysis::Constant::GetDouble(input2);
      local_70.data_ = (uint_type)(dVar2 + dVar1);
LAB_0020d150:
      if ((double)local_70.data_ == 0.0) goto joined_r0x0020d201;
      goto LAB_0020d207;
    }
    fVar7 = analysis::Constant::GetFloat(input1);
    fVar8 = analysis::Constant::GetFloat(input2);
    fVar8 = fVar8 + fVar7;
    break;
  default:
    __assert_fail("false && \"Unexpected operation\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x24a,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformFloatingPointOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  case OpFSub:
    if (iVar4 == 0x40) {
      dVar1 = analysis::Constant::GetDouble(input1);
      dVar2 = analysis::Constant::GetDouble(input2);
      local_70.data_ = (uint_type)(dVar1 - dVar2);
      goto LAB_0020d1f1;
    }
    fVar7 = analysis::Constant::GetFloat(input1);
    fVar8 = analysis::Constant::GetFloat(input2);
    fVar7 = fVar7 - fVar8;
LAB_0020d2f7:
    if (((fVar7 != 0.0) || (NAN(fVar7))) &&
       ((uVar5 = 0,
        puVar6 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start, NAN(fVar7) ||
        (0x7effffff < (int)ABS(fVar7) - 0x800000U)))) goto LAB_0020d399;
    local_70.data_._0_4_ = fVar7;
    goto LAB_0020d33f;
  case OpFMul:
    if (iVar4 == 0x40) {
      dVar1 = analysis::Constant::GetDouble(input1);
      dVar2 = analysis::Constant::GetDouble(input2);
      local_70.data_ = (uint_type)(dVar2 * dVar1);
      goto LAB_0020d150;
    }
    fVar7 = analysis::Constant::GetFloat(input1);
    fVar8 = analysis::Constant::GetFloat(input2);
    fVar8 = fVar8 * fVar7;
    break;
  case OpFDiv:
    bVar3 = HasZero(input2);
    if (bVar3) {
      uVar5 = 0;
      puVar6 = (pointer)0x0;
      goto LAB_0020d399;
    }
    if (iVar4 != 0x40) {
      fVar7 = analysis::Constant::GetFloat(input1);
      fVar8 = analysis::Constant::GetFloat(input2);
      fVar7 = fVar7 / fVar8;
      goto LAB_0020d2f7;
    }
    dVar1 = analysis::Constant::GetDouble(input1);
    dVar2 = analysis::Constant::GetDouble(input2);
    local_70.data_ = (uint_type)(dVar1 / dVar2);
LAB_0020d1f1:
    if ((double)local_70.data_ == 0.0) {
joined_r0x0020d201:
      if (NAN((double)local_70.data_)) goto LAB_0020d207;
    }
    else {
LAB_0020d207:
      if ((NAN((double)local_70.data_)) ||
         (0x3fe < (uint)((long)ABS((double)local_70.data_) + 0xfff0000000000000U >> 0x35))) {
        uVar5 = 0;
        puVar6 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        goto LAB_0020d399;
      }
    }
    utils::FloatProxy<double>::GetWords(&local_48,&local_70);
    goto LAB_0020d349;
  }
  if (((fVar8 == 0.0) && (!NAN(fVar8))) ||
     ((uVar5 = 0,
      puVar6 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start, !NAN(fVar8) &&
      ((int)ABS(fVar8) - 0x800000U < 0x7f000000)))) {
    local_70.data_._0_4_ = fVar8;
LAB_0020d33f:
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_48,(iterator)0x0,(uint *)&local_70);
LAB_0020d349:
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    c = analysis::ConstantManager::GetConstant(const_mgr,type,&local_68);
    uVar5 = 0;
    this = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c,0,(inst_iterator *)0x0);
    puVar6 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (this->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(this,(uint)this->has_type_id_);
      puVar6 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
LAB_0020d399:
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)local_68.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar6);
  }
  return uVar5;
}

Assistant:

uint32_t PerformFloatingPointOperation(analysis::ConstantManager* const_mgr,
                                       spv::Op opcode,
                                       const analysis::Constant* input1,
                                       const analysis::Constant* input2) {
  const analysis::Type* type = input1->type();
  assert(type->AsFloat());
  uint32_t width = type->AsFloat()->width();
  assert(width == 32 || width == 64);
  std::vector<uint32_t> words;
#define FOLD_OP(op)                                                          \
  if (width == 64) {                                                         \
    utils::FloatProxy<double> val =                                          \
        input1->GetDouble() op input2->GetDouble();                          \
    double dval = val.getAsFloat();                                          \
    if (!IsValidResult(dval)) return 0;                                      \
    words = val.GetWords();                                                  \
  } else {                                                                   \
    utils::FloatProxy<float> val = input1->GetFloat() op input2->GetFloat(); \
    float fval = val.getAsFloat();                                           \
    if (!IsValidResult(fval)) return 0;                                      \
    words = val.GetWords();                                                  \
  }                                                                          \
  static_assert(true, "require extra semicolon")
  switch (opcode) {
    case spv::Op::OpFMul:
      FOLD_OP(*);
      break;
    case spv::Op::OpFDiv:
      if (HasZero(input2)) return 0;
      FOLD_OP(/);
      break;
    case spv::Op::OpFAdd:
      FOLD_OP(+);
      break;
    case spv::Op::OpFSub:
      FOLD_OP(-);
      break;
    default:
      assert(false && "Unexpected operation");
      break;
  }
#undef FOLD_OP
  const analysis::Constant* merged_const = const_mgr->GetConstant(type, words);
  return const_mgr->GetDefiningInstruction(merged_const)->result_id();
}